

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowCustomAggregator::Evaluate
          (WindowCustomAggregator *this,WindowAggregatorState *gsink,WindowAggregatorState *lstate,
          DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  ArenaAllocator *this_00;
  shared_ptr<duckdb::FunctionDataWrapper,_true> *this_01;
  WindowExcludeMode WVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  ulong uVar6;
  aggregate_window_t p_Var7;
  pointer pWVar8;
  const_reference pvVar9;
  reference pvVar10;
  ulong uVar11;
  FunctionDataWrapper *pFVar12;
  type pWVar13;
  ulong uVar14;
  size_type __n;
  idx_t iVar15;
  ulong uVar16;
  const_data_ptr_t local_98;
  AggregateInputData local_48;
  
  if (gsink[7].allocator.allocator == (Allocator *)0x0) {
    local_98 = (const_data_ptr_t)0x0;
  }
  else {
    pWVar8 = unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
             ::operator->((unique_ptr<duckdb::WindowCustomAggregatorState,_std::default_delete<duckdb::WindowCustomAggregatorState>,_true>
                           *)&gsink[7].allocator);
    local_98 = (pWVar8->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  WVar1 = (this->super_WindowAggregator).exclude_mode;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  pdVar2 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  pdVar3 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  pdVar4 = pvVar9->data;
  pvVar9 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  if (count != 0) {
    this_00 = &lstate[7].allocator;
    pdVar5 = pvVar9->data;
    this_01 = &(this->super_WindowAggregator).aggr.bind_data_wrapper;
    iVar15 = 0;
    do {
      uVar16 = *(ulong *)(pdVar2 + iVar15 * 8);
      uVar6 = *(ulong *)(pdVar3 + iVar15 * 8);
      if (WVar1 == NO_OTHER) {
        __n = 0;
      }
      else {
        uVar11 = row_idx + iVar15;
        uVar14 = uVar11;
        if (WVar1 != CURRENT_ROW) {
          uVar14 = *(ulong *)(pdVar4 + iVar15 * 8);
        }
        if (uVar6 <= uVar14) {
          uVar14 = uVar6;
        }
        if (uVar14 <= uVar16) {
          uVar14 = uVar16;
        }
        pvVar10 = vector<duckdb::FrameBounds,_true>::operator[]
                            ((vector<duckdb::FrameBounds,_true> *)this_00,0);
        pvVar10->start = uVar16;
        pvVar10->end = uVar14;
        __n = 1;
        if (WVar1 == TIES) {
          if (uVar11 <= uVar16) {
            uVar11 = uVar16;
          }
          if (uVar6 <= uVar11) {
            uVar11 = uVar6;
          }
          uVar14 = row_idx + iVar15 + 1;
          if (uVar6 <= uVar14) {
            uVar14 = uVar6;
          }
          if (uVar14 <= uVar16) {
            uVar14 = uVar16;
          }
          pvVar10 = vector<duckdb::FrameBounds,_true>::operator[]
                              ((vector<duckdb::FrameBounds,_true> *)this_00,1);
          pvVar10->start = uVar11;
          pvVar10->end = uVar14;
          __n = 2;
        }
        if (WVar1 == CURRENT_ROW) {
          uVar11 = row_idx + iVar15 + 1;
        }
        else {
          uVar11 = *(ulong *)(pdVar5 + iVar15 * 8);
        }
        if (uVar16 < uVar11) {
          uVar16 = uVar11;
        }
        if (uVar6 <= uVar16) {
          uVar16 = uVar6;
        }
      }
      pvVar10 = vector<duckdb::FrameBounds,_true>::operator[]
                          ((vector<duckdb::FrameBounds,_true> *)this_00,__n);
      pvVar10->start = uVar16;
      pvVar10->end = uVar6;
      if ((this_01->internal).
          super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        local_48.bind_data.ptr = (FunctionData *)0x0;
      }
      else {
        pFVar12 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->(this_01);
        local_48.bind_data.ptr =
             (pFVar12->function_data).
             super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t
             .
             super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
             .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
      }
      local_48.combine_type = PRESERVE_INPUT;
      p_Var7 = (this->super_WindowAggregator).aggr.function.window;
      local_48.allocator = &lstate->allocator;
      pWVar13 = unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
                ::operator*((unique_ptr<duckdb::WindowPartitionInput,_std::default_delete<duckdb::WindowPartitionInput>,_true>
                             *)&gsink[7].allocator.initial_capacity);
      (*p_Var7)(&local_48,pWVar13,local_98,
                (data_ptr_t)lstate[5].allocator.arena_allocator.allocate_function,
                (SubFrames *)this_00,result,iVar15);
      iVar15 = iVar15 + 1;
    } while (count != iVar15);
  }
  return;
}

Assistant:

void WindowCustomAggregator::Evaluate(const WindowAggregatorState &gsink, WindowAggregatorState &lstate,
                                      const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) const {
	auto &lcstate = lstate.Cast<WindowCustomAggregatorState>();
	auto &frames = lcstate.frames;
	const_data_ptr_t gstate_p = nullptr;
	auto &gcsink = gsink.Cast<WindowCustomAggregatorGlobalState>();
	if (gcsink.gcstate) {
		gstate_p = gcsink.gcstate->state.data();
	}

	EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		// Extract the range
		AggregateInputData aggr_input_data(aggr.GetFunctionData(), lstate.allocator);
		aggr.function.window(aggr_input_data, *gcsink.partition_input, gstate_p, lcstate.state.data(), frames, result,
		                     i);
	});
}